

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_chainstatemanager_tests.cpp
# Opt level: O2

void __thiscall
validation_chainstatemanager_tests::chainstatemanager_snapshot_init::test_method
          (chainstatemanager_snapshot_init *this)

{
  long lVar1;
  _Head_base<0UL,_Chainstate_*,_false> _Var2;
  element_type *peVar3;
  bool bVar4;
  readonly_property65 rVar5;
  readonly_property<bool> rVar6;
  int iVar7;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar8;
  Chainstate *pCVar9;
  CBlockIndex *pCVar10;
  ChainstateManager *pCVar11;
  unit_test_log_t *puVar12;
  Chainstate *pCVar13;
  RecursiveMutex *pmutexIn;
  char *pcVar14;
  iterator pvVar15;
  iterator in_R9;
  iterator pvVar16;
  path *ppVar17;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *pUVar18;
  uint256 *__return_storage_ptr__;
  undefined1 auVar19 [8];
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  check_type cVar22;
  DisconnectedBlockTransactions *__return_storage_ptr___00;
  lazy_ostream *plVar20;
  char **ppcVar21;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  lazy_ostream local_2b8;
  undefined1 *local_2a8;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> all_chainstates;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  undefined1 local_180 [8];
  element_type *local_178;
  shared_count asStack_170 [2];
  BlockValidationState unused_state;
  DisconnectedBlockTransactions unused_pool;
  uint256 snapshot_tip_hash;
  path local_88;
  path snapshot_chainstate_dir;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar14 = "m_node.chainman";
  puVar8 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (&(this->super_SnapshotTestSetup).super_TestChain100Setup.super_TestingSetup.
                       super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
                      ,0x22e,"test_method","m_node.chainman");
  pCVar11 = (puVar8->_M_t).
            super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
            super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
            super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
  pCVar9 = ChainstateManager::ActiveChainstate(pCVar11);
  SnapshotTestSetup::SetupSnapshot((SnapshotTestSetup *)&unused_pool);
  ::node::FindSnapshotChainstateDir
            ((optional<fs::path> *)&unused_pool,&(pCVar11->m_options).datadir);
  std::filesystem::__cxx11::path::path(&snapshot_chainstate_dir.super_path,(path *)&unused_pool);
  std::_Optional_payload_base<fs::path>::_M_reset((_Optional_payload_base<fs::path> *)&unused_pool);
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = pcVar14;
  file.m_end = (iterator)0x234;
  file.m_begin = (iterator)&local_1b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1c0,msg);
  bVar4 = std::filesystem::exists(&snapshot_chainstate_dir.super_path);
  unused_state.super_ValidationState<BlockValidationResult>.m_mode._0_1_ = bVar4;
  unused_state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)0x0;
  unused_state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
  snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       (long)"!fs::exists(snapshot_chainstate_dir)" + 1;
  snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (long)"!fs::exists(snapshot_chainstate_dir)" + 0x24;
  unused_pool.m_max_mem_usage._0_1_ = 0;
  unused_pool.cachedInnerUsage = (uint64_t)&PTR__lazy_ostream_0113a070;
  unused_pool.queuedTx.
  super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)boost::unit_test::lazy_ostream::inst;
  local_1d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_1c8 = "";
  pvVar15 = &DAT_00000001;
  pvVar16 = (iterator)0x0;
  unused_pool.queuedTx.
  super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&snapshot_tip_hash;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&unused_state,(lazy_ostream *)&unused_pool,1,0,WARN,_cVar22,
             (size_t)&local_1d0,0x234);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &unused_state.super_ValidationState<BlockValidationResult>.m_reject_reason.
              _M_string_length);
  local_1e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar16;
  msg_00.m_begin = pvVar15;
  file_00.m_end = (iterator)0x235;
  file_00.m_begin = (iterator)&local_1e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1f0,
             msg_00);
  unused_state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       unused_state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
       0xffffffffffffff00;
  unused_state.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_01139f30;
  unused_state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  unused_state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_1f8 = "";
  ArgsManager::GetDataDirNet((path *)&local_88,&gArgs);
  __return_storage_ptr___00 = &unused_pool;
  fs::operator/((path *)__return_storage_ptr___00,(path *)&local_88,"chainstate_snapshot");
  pvVar15 = (iterator)0x2;
  ppVar17 = &snapshot_chainstate_dir;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
            (&unused_state,&local_200,0x235,1,2,ppVar17,"snapshot_chainstate_dir",
             __return_storage_ptr___00,"gArgs.GetDataDirNet() / \"chainstate_snapshot\"");
  std::filesystem::__cxx11::path::~path((path *)&unused_pool);
  std::filesystem::__cxx11::path::~path(&local_88);
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)ppVar17;
  msg_01.m_begin = pvVar15;
  file_01.m_end = (iterator)0x237;
  file_01.m_begin = (iterator)&local_210;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_220,
             msg_01);
  bVar4 = ChainstateManager::IsSnapshotActive(pCVar11);
  unused_state.super_ValidationState<BlockValidationResult>.m_mode._0_1_ = bVar4;
  unused_state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)0x0;
  unused_state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
  snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       (long)"!chainman.IsSnapshotActive()" + 1;
  snapshot_tip_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (long)"!chainman.IsSnapshotActive()" + 0x1c;
  unused_pool.m_max_mem_usage._0_1_ = 0;
  unused_pool.cachedInnerUsage = (uint64_t)&PTR__lazy_ostream_0113a070;
  unused_pool.queuedTx.
  super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)boost::unit_test::lazy_ostream::inst;
  local_230 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_228 = "";
  unused_pool.queuedTx.
  super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&snapshot_tip_hash;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&unused_state,(lazy_ostream *)&unused_pool,1,0,WARN,
             (check_type)__return_storage_ptr___00,(size_t)&local_230,0x237);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &unused_state.super_ValidationState<BlockValidationResult>.m_reject_reason.
              _M_string_length);
  pvVar15 = (iterator)0x239;
  pvVar16 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&unused_pool,&cs_main,
             "chainman.GetMutex()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
             ,0x239,false);
  pCVar10 = ChainstateManager::ActiveTip(pCVar11);
  CBlockIndex::GetBlockHash(&snapshot_tip_hash,pCVar10);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&unused_pool);
  ChainstateManager::GetAll(&all_chainstates,pCVar11);
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar16;
  msg_02.m_begin = pvVar15;
  file_02.m_end = (iterator)0x23c;
  file_02.m_begin = (iterator)&local_258;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_268,
             msg_02);
  unused_pool.m_max_mem_usage._0_1_ = 0;
  unused_pool.cachedInnerUsage = (uint64_t)&PTR__lazy_ostream_01139f30;
  unused_pool.queuedTx.
  super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)boost::unit_test::lazy_ostream::inst;
  unused_pool.queuedTx.
  super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0xc694e1;
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_270 = "";
  unused_state.super_ValidationState<BlockValidationResult>._0_8_ =
       (long)all_chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl
             .super__Vector_impl_data._M_finish -
       (long)all_chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl
             .super__Vector_impl_data._M_start >> 3;
  plVar20 = &local_2b8;
  local_2b8._vptr_lazy_ostream = (_func_int **)CONCAT44(local_2b8._vptr_lazy_ostream._4_4_,2);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&unused_pool,&local_278,0x23c,1,2,&unused_state,"all_chainstates.size()",plVar20,"2");
  DisconnectedBlockTransactions::DisconnectedBlockTransactions(&unused_pool,20000000);
  unused_state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)&unused_state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2;
  unused_state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
  unused_state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
  unused_state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
  unused_state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity =
       unused_state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
       _M_allocated_capacity & 0xffffffffffffff00;
  unused_state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)&unused_state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2;
  unused_state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
  unused_state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0]
       = '\0';
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock1,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
             ,0x246,false);
  pmutexIn = &pCVar9->m_mempool->cs;
  if (pCVar9->m_mempool == (CTxMemPool *)0x0) {
    pmutexIn = (RecursiveMutex *)0x0;
  }
  pvVar15 = (iterator)0x246;
  pvVar16 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock2,pmutexIn,"bg_chainstate.MempoolMutex()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
             ,0x246,false);
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar16;
  msg_03.m_begin = pvVar15;
  file_03.m_end = (iterator)0x247;
  file_03.m_begin = (iterator)&local_288;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_298,
             msg_03);
  rVar5.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)Chainstate::DisconnectTip(pCVar9,&unused_state,&unused_pool);
  local_180[0] = (class_property<bool>)
                 (class_property<bool>)
                 rVar5.super_readonly_property<bool>.super_class_property<bool>.value;
  local_178 = (element_type *)0x0;
  asStack_170[0].pi_ = (sp_counted_base *)0x0;
  local_2a0 = (UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_2c8;
  local_2c8 = "bg_chainstate.DisconnectTip(unused_state, &unused_pool)";
  local_2c0 = "";
  local_2b8.m_empty = false;
  local_2b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_2a8 = boost::unit_test::lazy_ostream::inst;
  local_2d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_2d0 = "";
  pvVar15 = &DAT_00000001;
  pvVar16 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_180,&local_2b8,1,0,WARN,(check_type)plVar20,
             (size_t)&local_2d8,0x247);
  boost::detail::shared_count::~shared_count(asStack_170);
  DisconnectedBlockTransactions::clear(&unused_pool);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar16;
  msg_04.m_begin = pvVar15;
  file_04.m_end = (iterator)0x24a;
  file_04.m_begin = (iterator)&local_2e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_2f8,
             msg_04);
  local_2b8.m_empty = false;
  local_2b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_2a8 = boost::unit_test::lazy_ostream::inst;
  local_2a0 = (UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)0xc694e1;
  local_308 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_300 = "";
  local_180._0_4_ =
       (int)((ulong)((long)(pCVar9->m_chain).vChain.
                           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)(pCVar9->m_chain).vChain.
                          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3) + -1;
  criticalblock1.super_unique_lock._M_device._0_4_ = 0x6d;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_2b8,&local_308,0x24a,1,2,local_180,"bg_chainstate.m_chain.Height()",
             &criticalblock1.super_unique_lock,"109");
  pCVar11 = SnapshotTestSetup::SimulateNodeRestart(&this->super_SnapshotTestSetup);
  local_180 = (undefined1  [8])0xc732b3;
  local_178 = (element_type *)0xc7332e;
  asStack_170[0].pi_ = (sp_counted_base *)0x251;
  puVar12 = boost::unit_test::unit_test_log_t::operator<<
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,(begin *)local_180);
  boost::unit_test::unit_test_log_t::operator()
            ((unit_test_log_t *)&criticalblock1,(log_level)puVar12);
  local_2b8.m_empty = false;
  local_2b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113aed0;
  local_2a8 = boost::unit_test::lazy_ostream::inst;
  local_2a0 = (UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)0xc740bd;
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)&criticalblock1,&local_2b8);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&criticalblock1);
  ChainTestingSetup::LoadVerifyActivateChainstate((ChainTestingSetup *)this);
  pvVar15 = (iterator)0x257;
  pvVar16 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock1,&cs_main,"chainman_restarted.GetMutex()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
             ,599,false);
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar16;
  msg_05.m_begin = pvVar15;
  file_05.m_end = (iterator)0x258;
  file_05.m_begin = (iterator)&local_318;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_328,
             msg_05);
  local_2b8.m_empty = false;
  local_2b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_2a8 = boost::unit_test::lazy_ostream::inst;
  local_2a0 = (UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)0xc694e1;
  local_338 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_330 = "";
  ChainstateManager::GetAll
            ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)local_180,pCVar11);
  criticalblock2.super_unique_lock._M_device =
       (mutex_type *)((long)local_178 - (long)local_180 >> 3);
  local_2c8 = (char *)CONCAT44(local_2c8._4_4_,2);
  ppcVar21 = &local_2c8;
  pvVar15 = (iterator)0x2;
  pUVar18 = &criticalblock2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&local_2b8,&local_338,600,1,2,&criticalblock2,"chainman_restarted.GetAll().size()",
             ppcVar21,"2");
  std::_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>::~_Vector_base
            ((_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_> *)local_180);
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = (iterator)pUVar18;
  msg_06.m_begin = pvVar15;
  file_06.m_end = (iterator)0x259;
  file_06.m_begin = (iterator)&local_348;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_358,
             msg_06);
  rVar6.super_class_property<bool>.value =
       (class_property<bool>)ChainstateManager::IsSnapshotActive(pCVar11);
  local_178 = (element_type *)0x0;
  asStack_170[0].pi_ = (sp_counted_base *)0x0;
  criticalblock2.super_unique_lock._M_device = (mutex_type *)0xc74388;
  criticalblock2.super_unique_lock._8_8_ = (long)"!chainman_restarted.IsSnapshotActive()" + 0x26;
  local_2b8.m_empty = false;
  local_2b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_2a8 = boost::unit_test::lazy_ostream::inst;
  local_368 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_360 = "";
  pvVar15 = &DAT_00000001;
  pvVar16 = (iterator)0x0;
  local_2a0 = &criticalblock2;
  local_180[0] = rVar6.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_180,&local_2b8,1,0,WARN,(check_type)ppcVar21,
             (size_t)&local_368,0x259);
  boost::detail::shared_count::~shared_count(asStack_170);
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pvVar16;
  msg_07.m_begin = pvVar15;
  file_07.m_end = (iterator)0x25a;
  file_07.m_begin = (iterator)&local_378;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_388,
             msg_07);
  local_180[0] = (class_property<bool>)true;
  if (((pCVar11->m_snapshot_chainstate)._M_t.
       super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
       super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
       super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl != (Chainstate *)0x0) &&
     (_Var2._M_head_impl =
           (pCVar11->m_ibd_chainstate)._M_t.
           super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
           super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
           super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl,
     _Var2._M_head_impl != (Chainstate *)0x0)) {
    local_180[0] = (class_property<bool>)((_Var2._M_head_impl)->m_disabled ^ 1);
  }
  local_178 = (element_type *)0x0;
  asStack_170[0].pi_ = (sp_counted_base *)0x0;
  criticalblock2.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_153d271;
  criticalblock2.super_unique_lock._8_8_ = (long)"!chainman_restarted.IsSnapshotValidated()" + 0x29;
  local_2b8.m_empty = false;
  local_2b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_2a8 = boost::unit_test::lazy_ostream::inst;
  local_398 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_390 = "";
  pvVar15 = &DAT_00000001;
  pvVar16 = (iterator)0x0;
  local_2a0 = &criticalblock2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_180,&local_2b8,1,0,WARN,(check_type)ppcVar21,
             (size_t)&local_398,0x25a);
  boost::detail::shared_count::~shared_count(asStack_170);
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_3a0 = "";
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar16;
  msg_08.m_begin = pvVar15;
  file_08.m_end = (iterator)0x25c;
  file_08.m_begin = (iterator)&local_3a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_3b8,
             msg_08);
  local_2b8.m_empty = false;
  local_2b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_2a8 = boost::unit_test::lazy_ostream::inst;
  local_2a0 = (UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)0xc694e1;
  local_3c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_3c0 = "";
  pCVar10 = ChainstateManager::ActiveTip(pCVar11);
  __return_storage_ptr__ = (uint256 *)local_180;
  CBlockIndex::GetBlockHash(__return_storage_ptr__,pCVar10);
  pvVar15 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&local_2b8,&local_3c8,0x25c,1,2,__return_storage_ptr__,
             "chainman_restarted.ActiveTip()->GetBlockHash()",&snapshot_tip_hash,"snapshot_tip_hash"
            );
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = (iterator)__return_storage_ptr__;
  msg_09.m_begin = pvVar15;
  file_09.m_end = (iterator)0x25d;
  file_09.m_begin = (iterator)&local_3d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_3e8,
             msg_09);
  local_2b8.m_empty = false;
  local_2b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_2a8 = boost::unit_test::lazy_ostream::inst;
  local_2a0 = (UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)0xc694e1;
  local_3f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_3f0 = "";
  iVar7 = ChainstateManager::ActiveHeight(pCVar11);
  local_180._0_4_ = iVar7;
  criticalblock2.super_unique_lock._M_device =
       (mutex_type *)CONCAT44(criticalblock2.super_unique_lock._M_device._4_4_,0xd2);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_2b8,&local_3f8,0x25d,1,2,local_180,"chainman_restarted.ActiveHeight()",
             &criticalblock2,"210");
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
  local_180 = (undefined1  [8])0xc732b3;
  local_178 = (element_type *)0xc7332e;
  asStack_170[0].pi_ = (sp_counted_base *)0x261;
  puVar12 = boost::unit_test::unit_test_log_t::operator<<
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,(begin *)local_180);
  boost::unit_test::unit_test_log_t::operator()
            ((unit_test_log_t *)&criticalblock1,(log_level)puVar12);
  local_2b8.m_empty = false;
  local_2b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113d750;
  local_2a8 = boost::unit_test::lazy_ostream::inst;
  local_2a0 = (UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)0xc741bd;
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)&criticalblock1,&local_2b8);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&criticalblock1);
  TestChain100Setup::mineBlocks((TestChain100Setup *)this,10);
  pvVar15 = (iterator)0x264;
  pvVar16 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock1,&cs_main,"chainman_restarted.GetMutex()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
             ,0x264,false);
  local_408 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = pvVar16;
  msg_10.m_begin = pvVar15;
  file_10.m_end = (iterator)0x265;
  file_10.m_begin = (iterator)&local_408;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_418,
             msg_10);
  local_2b8.m_empty = false;
  local_2b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_2a8 = boost::unit_test::lazy_ostream::inst;
  local_2a0 = (UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)0xc694e1;
  local_428 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_420 = "";
  iVar7 = ChainstateManager::ActiveHeight(pCVar11);
  pUVar18 = (UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)local_180;
  local_180._0_4_ = iVar7;
  criticalblock2.super_unique_lock._M_device =
       (mutex_type *)CONCAT44(criticalblock2.super_unique_lock._M_device._4_4_,0xdc);
  pvVar15 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_2b8,&local_428,0x265,1,2,pUVar18,"chainman_restarted.ActiveHeight()",
             &criticalblock2,"220");
  ChainstateManager::GetAll
            ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)local_180,pCVar11);
  peVar3 = local_178;
  for (auVar19 = local_180; auVar19 != (undefined1  [8])peVar3;
      auVar19 = (undefined1  [8])
                &(((element_type *)auVar19)->m_stream).
                 super_basic_ostream<char,_std::char_traits<char>_>.field_0x8) {
    pCVar9 = (Chainstate *)
             (((element_type *)auVar19)->m_stream).
             super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream;
    pCVar13 = ChainstateManager::ActiveChainstate(pCVar11);
    if (pCVar9 != pCVar13) {
      local_438 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
      ;
      local_430 = "";
      local_448 = &boost::unit_test::basic_cstring<char_const>::null;
      local_440 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_11.m_end = (iterator)pUVar18;
      msg_11.m_begin = pvVar15;
      file_11.m_end = (iterator)0x26b;
      file_11.m_begin = (iterator)&local_438;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_448,
                 msg_11);
      local_2b8.m_empty = false;
      local_2b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
      local_2a8 = boost::unit_test::lazy_ostream::inst;
      local_2a0 = (UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)0xc694e1;
      local_458 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
      ;
      local_450 = "";
      criticalblock2.super_unique_lock._M_device =
           (mutex_type *)
           CONCAT44(criticalblock2.super_unique_lock._M_device._4_4_,
                    (int)((ulong)((long)(pCVar9->m_chain).vChain.
                                        super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pCVar9->m_chain).vChain.
                                       super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1);
      local_2c8 = (char *)CONCAT44(local_2c8._4_4_,0x6d);
      pvVar15 = (iterator)0x2;
      pUVar18 = &criticalblock2;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
                (&local_2b8,&local_458,0x26b,1,2,&criticalblock2,"cs->m_chain.Height()",&local_2c8,
                 "109");
    }
  }
  std::_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>::~_Vector_base
            ((_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_> *)local_180);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
  ValidationState<BlockValidationResult>::~ValidationState
            (&unused_state.super_ValidationState<BlockValidationResult>);
  DisconnectedBlockTransactions::~DisconnectedBlockTransactions(&unused_pool);
  std::_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>::~_Vector_base
            (&all_chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>);
  std::filesystem::__cxx11::path::~path(&snapshot_chainstate_dir.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(chainstatemanager_snapshot_init, SnapshotTestSetup)
{
    ChainstateManager& chainman = *Assert(m_node.chainman);
    Chainstate& bg_chainstate = chainman.ActiveChainstate();

    this->SetupSnapshot();

    fs::path snapshot_chainstate_dir = *node::FindSnapshotChainstateDir(chainman.m_options.datadir);
    BOOST_CHECK(fs::exists(snapshot_chainstate_dir));
    BOOST_CHECK_EQUAL(snapshot_chainstate_dir, gArgs.GetDataDirNet() / "chainstate_snapshot");

    BOOST_CHECK(chainman.IsSnapshotActive());
    const uint256 snapshot_tip_hash = WITH_LOCK(chainman.GetMutex(),
        return chainman.ActiveTip()->GetBlockHash());

    auto all_chainstates = chainman.GetAll();
    BOOST_CHECK_EQUAL(all_chainstates.size(), 2);

    // "Rewind" the background chainstate so that its tip is not at the
    // base block of the snapshot - this is so after simulating a node restart,
    // it will initialize instead of attempting to complete validation.
    //
    // Note that this is not a realistic use of DisconnectTip().
    DisconnectedBlockTransactions unused_pool{MAX_DISCONNECTED_TX_POOL_BYTES};
    BlockValidationState unused_state;
    {
        LOCK2(::cs_main, bg_chainstate.MempoolMutex());
        BOOST_CHECK(bg_chainstate.DisconnectTip(unused_state, &unused_pool));
        unused_pool.clear();  // to avoid queuedTx assertion errors on teardown
    }
    BOOST_CHECK_EQUAL(bg_chainstate.m_chain.Height(), 109);

    // Test that simulating a shutdown (resetting ChainstateManager) and then performing
    // chainstate reinitializing successfully cleans up the background-validation
    // chainstate data, and we end up with a single chainstate that is at tip.
    ChainstateManager& chainman_restarted = this->SimulateNodeRestart();

    BOOST_TEST_MESSAGE("Performing Load/Verify/Activate of chainstate");

    // This call reinitializes the chainstates.
    this->LoadVerifyActivateChainstate();

    {
        LOCK(chainman_restarted.GetMutex());
        BOOST_CHECK_EQUAL(chainman_restarted.GetAll().size(), 2);
        BOOST_CHECK(chainman_restarted.IsSnapshotActive());
        BOOST_CHECK(!chainman_restarted.IsSnapshotValidated());

        BOOST_CHECK_EQUAL(chainman_restarted.ActiveTip()->GetBlockHash(), snapshot_tip_hash);
        BOOST_CHECK_EQUAL(chainman_restarted.ActiveHeight(), 210);
    }

    BOOST_TEST_MESSAGE(
        "Ensure we can mine blocks on top of the initialized snapshot chainstate");
    mineBlocks(10);
    {
        LOCK(chainman_restarted.GetMutex());
        BOOST_CHECK_EQUAL(chainman_restarted.ActiveHeight(), 220);

        // Background chainstate should be unaware of new blocks on the snapshot
        // chainstate.
        for (Chainstate* cs : chainman_restarted.GetAll()) {
            if (cs != &chainman_restarted.ActiveChainstate()) {
                BOOST_CHECK_EQUAL(cs->m_chain.Height(), 109);
            }
        }
    }
}